

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void vera::setWindowSize(int _width,int _height)

{
  GLFWwindow *handle;
  float fVar1;
  float fVar2;
  int _height_local;
  int _width_local;
  
  handle = window;
  if (properties.style != EMBEDDED) {
    fVar1 = getPixelDensity(true);
    fVar2 = getPixelDensity(true);
    glfwSetWindowSize(handle,(int)((float)_width / fVar1),(int)((float)_height / fVar2));
  }
  fVar1 = getPixelDensity(true);
  fVar2 = getPixelDensity(true);
  setViewport((float)_width / fVar1,(float)_height / fVar2);
  return;
}

Assistant:

void setWindowSize(int _width, int _height) {
#if defined(__EMSCRIPTEN__)
    setViewport((float)_width, (float)_height);
    glfwSetWindowSize(window, _width * getPixelDensity(true), _height * getPixelDensity(true));
    return;

#elif defined(DRIVER_GLFW)
    if (properties.style != EMBEDDED)
        glfwSetWindowSize(window, _width / getPixelDensity(true), _height / getPixelDensity(true));
#endif

    setViewport((float)_width / getPixelDensity(true), (float)_height / getPixelDensity(true));
}